

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

Vec_Int_t *
Acb_NtkCollectCopies(Acb_Ntk_t *p,Gia_Man_t *pGia,Vec_Ptr_t **pvNodesR,Vec_Bit_t **pvPolar)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  void **__s;
  void *__s_00;
  Vec_Bit_t *pVVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  ulong uVar12;
  Vec_Int_t *pVVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  size_t __size;
  long lVar18;
  long lVar19;
  int iVar20;
  
  uVar15 = (p->vTargets).nSize;
  __ptr = Acb_NtkFindNodes2(p);
  iVar4 = (p->vObjType).nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar20 = 0x10;
  if (0xe < iVar4 - 2U) {
    iVar20 = iVar4 + -1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar20;
  if (iVar20 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar20 << 2);
  }
  p_00->pArray = piVar6;
  uVar2 = pGia->nObjs;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  uVar14 = 8;
  if (6 < uVar2 - 1) {
    uVar14 = uVar2;
  }
  pVVar7->nCap = uVar14;
  if (uVar14 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar14 << 3);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = uVar2;
  sVar10 = 0;
  memset(__s,0,(long)(int)uVar2 << 3);
  iVar20 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  iVar4 = iVar20 * 0x20;
  if (iVar20 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    sVar10 = (long)iVar20 * 4;
    __s_00 = malloc(sVar10);
  }
  __size = 0;
  memset(__s_00,0,sVar10);
  pVVar8 = (Vec_Bit_t *)malloc(0x10);
  pVVar8->nCap = iVar4;
  if (iVar20 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    __size = (long)iVar20 << 2;
    piVar6 = (int *)malloc(__size);
  }
  pVVar8->pArray = piVar6;
  pVVar8->nSize = iVar4;
  memset(piVar6,0,__size);
  pVVar13 = pGia->vCis;
  uVar12 = (ulong)(uint)pVVar13->nSize;
  if (0 < pVVar13->nSize) {
    lVar18 = 0;
    do {
      iVar20 = pVVar13->pArray[lVar18];
      if (((long)iVar20 < 0) || (pGia->nObjs <= iVar20)) goto LAB_003af97b;
      if (iVar20 == 0) break;
      if (lVar18 < (int)((int)uVar12 - uVar15)) {
        if ((p->vCis).nSize <= lVar18) goto LAB_003af95c;
        uVar14 = (p->vCis).pArray[lVar18];
      }
      else {
        uVar12 = (ulong)(uint)-(int)uVar12 + (ulong)uVar15 + lVar18;
        iVar5 = (int)uVar12;
        if ((iVar5 < 0) || ((p->vTargets).nSize <= iVar5)) goto LAB_003af95c;
        uVar14 = (p->vTargets).pArray[uVar12 & 0xffffffff];
      }
      if ((long)(int)uVar14 < 1) goto LAB_003af9e1;
      uVar17 = (p->vObjName).nSize;
      if ((int)uVar17 < 1) goto LAB_003af99a;
      if (uVar17 <= uVar14) goto LAB_003af95c;
      pcVar9 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[(int)uVar14]);
      if (pcVar9 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        sVar10 = strlen(pcVar9);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,pcVar9);
      }
      if ((int)uVar2 <= iVar20) goto LAB_003afa00;
      __s[iVar20] = pcVar11;
      lVar18 = lVar18 + 1;
      pVVar13 = pGia->vCis;
      uVar12 = (ulong)pVVar13->nSize;
    } while (lVar18 < (long)uVar12);
  }
  pVVar13 = pGia->vCos;
  if (0 < pVVar13->nSize) {
    lVar18 = 0;
    do {
      iVar20 = pVVar13->pArray[lVar18];
      lVar19 = (long)iVar20;
      if ((lVar19 < 0) || (pGia->nObjs <= iVar20)) goto LAB_003af97b;
      if (iVar20 == 0) break;
      uVar15 = iVar20 - (*(uint *)(pGia->pObjs + lVar19) & 0x1fffffff);
      if (((int)uVar15 < 0) || (iVar4 <= (int)uVar15)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      puVar1 = (uint *)((long)__s_00 + (ulong)(uVar15 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar15 & 0x1f);
      if ((p->vCos).nSize <= lVar18) goto LAB_003af95c;
      uVar15 = (p->vCos).pArray[lVar18];
      if ((long)(int)uVar15 < 1) {
LAB_003af9e1:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
      }
      uVar14 = (p->vObjName).nSize;
      if ((int)uVar14 < 1) goto LAB_003af99a;
      if (uVar14 <= uVar15) goto LAB_003af95c;
      pcVar9 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[(int)uVar15]);
      if (pcVar9 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        sVar10 = strlen(pcVar9);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,pcVar9);
      }
      if ((int)uVar2 <= iVar20) {
LAB_003afa00:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      __s[lVar19] = pcVar11;
      Vec_IntPush(p_00,iVar20);
      lVar18 = lVar18 + 1;
      pVVar13 = pGia->vCos;
    } while (lVar18 < pVVar13->nSize);
  }
  iVar20 = __ptr->nSize;
  if (0 < (long)iVar20) {
    piVar6 = __ptr->pArray;
    lVar18 = 0;
    do {
      uVar15 = piVar6[lVar18];
      lVar19 = (long)(int)uVar15;
      if (lVar19 < 1) {
        pcVar9 = "i>0";
LAB_003af9c9:
        __assert_fail(pcVar9,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
      }
      uVar14 = (p->vObjCopy).nSize;
      if ((int)uVar14 < 1) {
        pcVar9 = "Acb_NtkHasObjCopies(p)";
        goto LAB_003af9c9;
      }
      if (uVar14 <= uVar15) goto LAB_003af95c;
      uVar14 = (p->vObjCopy).pArray[lVar19];
      if (-1 < (int)uVar14) {
        uVar17 = uVar14 >> 1;
        if (pGia->nObjs <= (int)uVar17) {
LAB_003af97b:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(pGia->pObjs + uVar17) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(pGia->pObjs + uVar17)) {
          if (iVar4 <= (int)uVar17) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          uVar12 = (ulong)(uVar14 >> 6);
          uVar16 = 1 << ((byte)uVar17 & 0x1f);
          if ((*(uint *)((long)__s_00 + uVar12 * 4) >> (uVar17 & 0x1f) & 1) == 0) {
            if ((int)uVar2 <= (int)uVar17) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if (__s[uVar17] == (void *)0x0) {
              uVar3 = (p->vObjName).nSize;
              if ((int)uVar3 < 1) {
LAB_003af99a:
                __assert_fail("Acb_NtkHasObjNames(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                              ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
              }
              if (uVar3 <= uVar15) {
LAB_003af95c:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              pcVar9 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[lVar19]);
              if (pcVar9 == (char *)0x0) {
                pcVar11 = (char *)0x0;
              }
              else {
                sVar10 = strlen(pcVar9);
                pcVar11 = (char *)malloc(sVar10 + 1);
                strcpy(pcVar11,pcVar9);
              }
              __s[uVar17] = pcVar11;
              Vec_IntPush(p_00,uVar17);
              if ((uVar14 & 1) == 0) {
                pVVar8->pArray[uVar12] = pVVar8->pArray[uVar12] & ~uVar16;
              }
              else {
                pVVar8->pArray[uVar12] = pVVar8->pArray[uVar12] | uVar16;
              }
            }
          }
        }
      }
      lVar18 = lVar18 + 1;
    } while (iVar20 != lVar18);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  qsort(p_00->pArray,(long)p_00->nSize,4,Vec_IntSortCompare1);
  *pvNodesR = pVVar7;
  *pvPolar = pVVar8;
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkCollectCopies( Acb_Ntk_t * p, Gia_Man_t * pGia, Vec_Ptr_t ** pvNodesR, Vec_Bit_t ** pvPolar )
{
    int i, iObj, iLit, nTargets = Vec_IntSize(&p->vTargets);
    Vec_Int_t * vObjs   = Acb_NtkFindNodes2( p );
    Vec_Int_t * vNodes  = Vec_IntAlloc( Acb_NtkObjNum(p) );
    Vec_Ptr_t * vNodesR = Vec_PtrStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vDriver = Vec_BitStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vPolar  = Vec_BitStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCiId( pGia, iObj, i )
        if ( i < Gia_ManCiNum(pGia) - nTargets )
            Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Acb_ObjNameStr(p, Acb_NtkCi(p, i))) );
        else
            Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Acb_ObjNameStr(p, Vec_IntEntry(&p->vTargets, i-(Gia_ManCiNum(pGia) - nTargets)))) );
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        Vec_BitWriteEntry( vDriver, Gia_ObjFaninId0(Gia_ManObj(pGia, iObj), iObj), 1 );
        Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Acb_ObjNameStr(p, Acb_NtkCo(p, i))) );
        Vec_IntPush( vNodes, iObj );
    }
    Vec_IntForEachEntry( vObjs, iObj, i )
        if ( (iLit = Acb_ObjCopy(p, iObj)) >= 0 && Gia_ObjIsAnd(Gia_ManObj(pGia, Abc_Lit2Var(iLit))) )
        {
            if ( !Vec_BitEntry(vDriver, Abc_Lit2Var(iLit)) && Vec_PtrEntry(vNodesR, Abc_Lit2Var(iLit)) == NULL )
            {
                Vec_PtrWriteEntry( vNodesR, Abc_Lit2Var(iLit), Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
                Vec_IntPush( vNodes, Abc_Lit2Var(iLit) );
                Vec_BitWriteEntry( vPolar, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit) );
            }
        }
    Vec_BitFree( vDriver );
    Vec_IntFree( vObjs );
    Vec_IntSort( vNodes, 0 );
    *pvNodesR = vNodesR;
    *pvPolar  = vPolar;
    return vNodes;
}